

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.c
# Opt level: O2

void NodeDumpObject(node *p,textwriter_conflict *Text)

{
  uint uVar1;
  long lVar2;
  char *pcVar3;
  array local_78;
  node *p_local;
  tchar_t Element [8];
  textwriter_conflict Level;
  
  p_local = p;
  uVar1 = NodeClassFlags(p);
  if ((uVar1 & 0x10) == 0) {
    if (p == (node *)0x0) {
      __assert_fail("(const void*)(p)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/parser/parser2.c"
                    ,0x486,"void NodeDumpObject(node *, textwriter *)");
    }
    FourCCToString(Element,8,*(fourcc_t *)((long)p->VMT + 8));
    TextElementBegin(&Level,Text,Element);
    TextAttrib(&Level,"Addr",&p_local,0xf);
    TextSerializeNode(&Level,p_local,0x40000,0);
    local_78._Begin = (char *)0x0;
    local_78._Used = 0;
    if (p_local == (node *)0x0) {
      __assert_fail("(const void*)(p)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/parser/parser2.c"
                    ,0x48b,"void NodeDumpObject(node *, textwriter *)");
    }
    lVar2 = (**(code **)((long)p_local->VMT + 0x18))(p_local,0xd,&local_78,0x10);
    if (lVar2 == 0) {
      for (pcVar3 = local_78._Begin;
          pcVar3 != local_78._Begin + (local_78._Used & 0xfffffffffffffff8); pcVar3 = pcVar3 + 8) {
        NodeDumpObject(*(node **)pcVar3,&Level);
      }
    }
    ArrayClear(&local_78);
    TextElementEnd(&Level);
  }
  return;
}

Assistant:

static void NodeDumpObject(node* p,textwriter* Text)
{
    textwriter Level;
    array Children;
    tchar_t Element[8];
    node** i;

    if (!(NodeClassFlags(p) & CFLAG_LOCAL)) // example skin UI stuff
    {
        FourCCToString(Element,TSIZEOF(Element),Node_ClassId(p));
        TextElementBegin(&Level,Text,Element);
        TextAttrib(&Level,T("Addr"),&p,TYPE_PTR);
        TextSerializeNode(&Level,p,TFLAG_NODUMP,0);
        ArrayInit(&Children);
        if (Node_GET(p,NODE_CHILDREN,&Children)==ERR_NONE)
            for (i=ARRAYBEGIN(Children,node*);i!=ARRAYEND(Children,node*);++i)
                NodeDumpObject(*i,&Level);
        ArrayClear(&Children);
        TextElementEnd(&Level);
    }
}